

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O3

void __thiscall Robot::communicate(Robot *this)

{
  Serial *pSVar1;
  int iVar2;
  int *piVar3;
  string result;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  writeDuty(this);
  pSVar1 = this->mySerial;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\n","");
  serial::Serial::readline(&local_b0,pSVar1,0x18,&local_50);
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  setCount(this,&local_90);
  do {
    local_b0._M_dataplus._M_p = (pointer)0x0;
    local_b0._M_string_length = 10000000;
    do {
      iVar2 = nanosleep((timespec *)&local_b0,(timespec *)&local_b0);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    writeDuty(this);
    pSVar1 = this->mySerial;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n","");
    serial::Serial::readline(&local_b0,pSVar1,0x18,&local_70);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    setCount(this,&local_90);
    calcSpeed(this);
    calcVelocityAndTheta(this);
    calcWorldVelocity(this);
    calcPosition(this);
  } while( true );
}

Assistant:

void Robot::communicate() {
    std::string result;
    this->writeDuty();
    result = this->mySerial->readline(24, "\n");
    this->setCount(result);
    while(true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        this->writeDuty();
        result = this->mySerial->readline(24, "\n");
        this->setCount(result);
        this->calcSpeed();
        /*std::cout << this->robotInfo.wheelVelocity[0] << "\t" << this->robotInfo.wheelVelocity[1]
        << "\t" << this->robotInfo.wheelVelocity[2] << std::endl;*/
        this->calcVelocityAndTheta();
        this->calcWorldVelocity();
        this->calcPosition();
    }
}